

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

void * reserve_buffer(flatcc_builder_t *B,int alloc_type,size_t used,size_t need,int zero_init)

{
  int iVar1;
  
  if (B->buffers[(uint)alloc_type].iov_len < need + used) {
    iVar1 = (*B->alloc)(B->alloc_context,B->buffers + (uint)alloc_type,need + used,zero_init,
                        alloc_type);
    if (iVar1 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x13c,"void *reserve_buffer(flatcc_builder_t *, int, size_t, size_t, int)");
    }
  }
  return (void *)(used + (long)B->buffers[(uint)alloc_type].iov_base);
}

Assistant:

static inline void *reserve_buffer(flatcc_builder_t *B, int alloc_type, size_t used, size_t need, int zero_init)
{
    iovec_t *buf = B->buffers + alloc_type;

    if (used + need > buf->iov_len) {
        if (B->alloc(B->alloc_context, buf, used + need, zero_init, alloc_type)) {
            check(0, "memory allocation failed");
            return 0;
        }
    }
    return (void *)((size_t)buf->iov_base + used);
}